

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::OutputFile::Data::Data(Data *this,int numThreads)

{
  long in_RDI;
  size_type __new_size;
  vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
  *this_00;
  undefined8 in_stack_ffffffffffffffb8;
  Compression compression;
  V2f *in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int local_18;
  Vec2<float> local_14 [2];
  
  compression = (Compression)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  Imath_2_5::Vec2<float>::Vec2(local_14,0.0,0.0);
  Header::Header((Header *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                 in_stack_ffffffffffffffc8,(float)((ulong)in_RDI >> 0x20),(LineOrder)in_RDI,
                 compression);
  FrameBuffer::FrameBuffer((FrameBuffer *)0x86c562);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x86c578);
  __new_size = in_RDI + 0xb0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x86c58e);
  this_00 = (vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
             *)(in_RDI + 200);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x86c5a4);
  std::
  vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
  ::vector((vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
            *)0x86c5ba);
  *(undefined8 *)(in_RDI + 0x100) = 0;
  std::
  vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
  ::vector((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
            *)0x86c5e3);
  *(undefined4 *)(in_RDI + 0x130) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x138) = 0;
  *(undefined1 *)(in_RDI + 0x140) = 0;
  local_18 = 1;
  std::max<int>(&local_18,(int *)&stack0xffffffffffffffe4);
  std::
  vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
  ::resize(this_00,__new_size);
  return;
}

Assistant:

OutputFile::Data::Data (int numThreads):
    lineOffsetsPosition (0),
    partNumber (-1),
    _streamData(0),
    _deleteStream(false)
{
    //
    // We need at least one lineBuffer, but if threading is used,
    // to keep n threads busy we need 2*n lineBuffers.
    //

    lineBuffers.resize (max (1, 2 * numThreads));
}